

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadSceneNode(ColladaParser *this,Node *pNode)

{
  pointer *pppNVar1;
  iterator __position;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  Node *pNVar7;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  mapped_type *ppNVar8;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  Logger *pLVar9;
  TransformType pType;
  char *pcVar10;
  pointer pCVar11;
  string *this_00;
  string *psVar12;
  Node *child;
  undefined1 local_88 [40];
  string *local_60;
  vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
  *local_58;
  vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_> *local_50;
  vector<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_> *local_48;
  vector<Assimp::Collada::Node*,std::allocator<Assimp::Collada::Node*>> *local_40;
  NodeLibrary *local_38;
  
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar4 == '\0') &&
     (iVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar4 != '\0')) {
    local_60 = (string *)&pNode->mPrimaryCamera;
    local_58 = &pNode->mCameras;
    local_50 = &pNode->mLights;
    local_48 = &pNode->mNodeInstances;
    local_40 = (vector<Assimp::Collada::Node*,std::allocator<Assimp::Collada::Node*>> *)
               &pNode->mChildren;
    local_38 = &this->mNodeLibrary;
    do {
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar5 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar4 == 1) {
        if (iVar5 != 1) goto LAB_00403115;
        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar4 = strcmp((char *)CONCAT44(extraout_var,iVar4),"node");
        if (iVar4 == 0) {
          pNVar7 = (Node *)operator_new(0x118);
          (pNVar7->mName)._M_dataplus._M_p = (pointer)&(pNVar7->mName).field_2;
          (pNVar7->mName)._M_string_length = 0;
          (pNVar7->mName).field_2._M_local_buf[0] = '\0';
          (pNVar7->mID)._M_dataplus._M_p = (pointer)&(pNVar7->mID).field_2;
          (pNVar7->mID)._M_string_length = 0;
          (pNVar7->mID).field_2._M_local_buf[0] = '\0';
          (pNVar7->mSID)._M_dataplus._M_p = (pointer)&(pNVar7->mSID).field_2;
          (pNVar7->mSID)._M_string_length = 0;
          (pNVar7->mSID).field_2._M_local_buf[0] = '\0';
          memset(&pNVar7->mParent,0,0x98);
          (pNVar7->mPrimaryCamera)._M_dataplus._M_p = (pointer)&(pNVar7->mPrimaryCamera).field_2;
          (pNVar7->mPrimaryCamera)._M_string_length = 0;
          (pNVar7->mPrimaryCamera).field_2._M_local_buf[0] = '\0';
          local_88._0_8_ = pNVar7;
          iVar4 = TestAttribute(this,"id");
          if (-1 < iVar4) {
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])();
            pcVar10 = *(char **)(local_88._0_8_ + 0x28);
            psVar12 = (string *)(local_88._0_8_ + 0x20);
            strlen((char *)CONCAT44(extraout_var_08,iVar4));
            std::__cxx11::string::_M_replace
                      ((ulong)psVar12,0,pcVar10,CONCAT44(extraout_var_08,iVar4));
          }
          iVar4 = TestAttribute(this,"sid");
          if (-1 < iVar4) {
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])();
            pcVar10 = *(char **)(local_88._0_8_ + 0x48);
            psVar12 = (string *)(local_88._0_8_ + 0x40);
            strlen((char *)CONCAT44(extraout_var_09,iVar4));
            std::__cxx11::string::_M_replace
                      ((ulong)psVar12,0,pcVar10,CONCAT44(extraout_var_09,iVar4));
          }
          iVar4 = TestAttribute(this,"name");
          if (-1 < iVar4) {
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])();
            uVar2 = local_88._0_8_;
            pcVar10 = *(char **)(local_88._0_8_ + 8);
            strlen((char *)CONCAT44(extraout_var_10,iVar4));
            std::__cxx11::string::_M_replace(uVar2,0,pcVar10,CONCAT44(extraout_var_10,iVar4));
          }
          uVar2 = local_88._0_8_;
          if (pNode == (Node *)0x0) {
            ppNVar8 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>_>
                      ::operator[](local_38,(key_type *)(local_88._0_8_ + 0x20));
            *ppNVar8 = (mapped_type)uVar2;
          }
          else {
            __position._M_current =
                 (pNode->mChildren).
                 super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pNode->mChildren).
                super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Assimp::Collada::Node*,std::allocator<Assimp::Collada::Node*>>::
              _M_realloc_insert<Assimp::Collada::Node*const&>(local_40,__position,(Node **)local_88)
              ;
            }
            else {
              *__position._M_current = (Node *)local_88._0_8_;
              pppNVar1 = &(pNode->mChildren).
                          super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppNVar1 = *pppNVar1 + 1;
            }
            *(Node **)(local_88._0_8_ + 0x60) = pNode;
          }
          ReadSceneNode(this,(Node *)local_88._0_8_);
        }
        else if (pNode != (Node *)0x0) {
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar4 != 1) {
LAB_00403115:
            __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                          ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
          }
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar4 = strcmp((char *)CONCAT44(extraout_var_00,iVar4),"lookat");
          if (iVar4 == 0) {
            pType = TF_LOOKAT;
          }
          else {
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar4 != 1) goto LAB_00403115;
            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar4 = strcmp((char *)CONCAT44(extraout_var_01,iVar4),"matrix");
            if (iVar4 == 0) {
              pType = TF_MATRIX;
            }
            else {
              iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar4 != 1) goto LAB_00403115;
              iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar4 = strcmp((char *)CONCAT44(extraout_var_02,iVar4),"rotate");
              if (iVar4 == 0) {
                pType = TF_ROTATE;
              }
              else {
                iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                if (iVar4 != 1) goto LAB_00403115;
                iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar4 = strcmp((char *)CONCAT44(extraout_var_03,iVar4),"scale");
                if (iVar4 == 0) {
                  pType = TF_SCALE;
                }
                else {
                  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                  if (iVar4 != 1) goto LAB_00403115;
                  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar4 = strcmp((char *)CONCAT44(extraout_var_04,iVar4),"skew");
                  if (iVar4 == 0) {
                    pType = TF_SKEW;
                  }
                  else {
                    iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                    if (iVar4 != 1) goto LAB_00403115;
                    iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                    iVar4 = strcmp((char *)CONCAT44(extraout_var_05,iVar4),"translate");
                    if (iVar4 != 0) {
                      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                      if (iVar4 != 1) goto LAB_00403115;
                      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                      iVar4 = strcmp((char *)CONCAT44(extraout_var_06,iVar4),"render");
                      if (((iVar4 == 0) && (pNode->mParent == (Node *)0x0)) &&
                         ((pNode->mPrimaryCamera)._M_string_length == 0)) {
                        uVar6 = TestAttribute(this,"camera_node");
                        if (uVar6 != 0xffffffff) {
                          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                            (this->mReader,(ulong)uVar6);
                          pcVar10 = (char *)CONCAT44(extraout_var_14,iVar4);
                          this_00 = local_60;
                          if (*pcVar10 == '#') {
LAB_0040307e:
                            std::__cxx11::string::operator=(this_00,pcVar10 + 1);
                          }
                          else {
                            pLVar9 = DefaultLogger::get();
                            pcVar10 = "Collada: Unresolved reference format of camera";
LAB_00402fe1:
                            Logger::error(pLVar9,pcVar10);
                          }
                        }
                      }
                      else {
                        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                        if (iVar4 != 1) goto LAB_00403115;
                        iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                        iVar4 = strcmp((char *)CONCAT44(extraout_var_07,iVar4),"instance_node");
                        if (iVar4 == 0) {
                          uVar6 = TestAttribute(this,"url");
                          if (uVar6 != 0xffffffff) {
                            iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                              (this->mReader,(ulong)uVar6);
                            if (*(char *)CONCAT44(extraout_var_11,iVar4) != '#') {
                              pLVar9 = DefaultLogger::get();
                              pcVar10 = "Collada: Unresolved reference format of node";
                              goto LAB_00402fe1;
                            }
                            local_88._24_8_ = 0;
                            local_88._8_8_ = 0;
                            local_88._16_8_ = 0;
                            local_88._0_8_ = (Node *)(local_88 + 0x10);
                            std::
                            vector<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
                            ::emplace_back<Assimp::Collada::NodeInstance>
                                      (local_48,(NodeInstance *)local_88);
                            if ((Node *)local_88._0_8_ != (Node *)(local_88 + 0x10)) {
                              operator_delete((void *)local_88._0_8_);
                            }
                            std::__cxx11::string::operator=
                                      ((string *)
                                       ((pNode->mNodeInstances).
                                        super__Vector_base<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + -1),
                                       (char *)CONCAT44(extraout_var_11,iVar4) + 1);
                          }
                        }
                        else {
                          bVar3 = IsElement(this,"instance_geometry");
                          if ((bVar3) || (bVar3 = IsElement(this,"instance_controller"), bVar3)) {
                            ReadNodeGeometry(this,pNode);
                          }
                          else {
                            bVar3 = IsElement(this,"instance_light");
                            if (bVar3) {
                              uVar6 = TestAttribute(this,"url");
                              pNVar7 = (Node *)(local_88 + 0x10);
                              if (uVar6 != 0xffffffff) {
                                iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                                  (this->mReader,(ulong)uVar6);
                                pcVar10 = (char *)CONCAT44(extraout_var_12,iVar4);
                                local_88._0_8_ = pNVar7;
                                if (*pcVar10 != '#') {
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_88,
                                             "Unknown reference format in <instance_light> element",
                                             "");
                                  ThrowException(this,(string *)local_88);
                                }
                                local_88._24_8_ = 0;
                                local_88._8_8_ = 0;
                                local_88._16_8_ = 0;
                                std::
                                vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>
                                ::emplace_back<Assimp::Collada::LightInstance>
                                          (local_50,(LightInstance *)local_88);
                                if ((Node *)local_88._0_8_ != pNVar7) {
                                  operator_delete((void *)local_88._0_8_);
                                }
                                pCVar11 = (pointer)(pNode->mLights).
                                                                                                      
                                                  super__Vector_base<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
LAB_00403077:
                                this_00 = (string *)(pCVar11 + -1);
                                goto LAB_0040307e;
                              }
                              pLVar9 = DefaultLogger::get();
                              pcVar10 = 
                              "Collada: Expected url attribute in <instance_light> element";
                            }
                            else {
                              bVar3 = IsElement(this,"instance_camera");
                              if (!bVar3) {
                                SkipElement(this);
                                goto LAB_00402e9f;
                              }
                              uVar6 = TestAttribute(this,"url");
                              if (uVar6 != 0xffffffff) {
                                iVar4 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                                  (this->mReader,(ulong)uVar6);
                                pcVar10 = (char *)CONCAT44(extraout_var_13,iVar4);
                                if (*pcVar10 != '#') {
                                  local_88._0_8_ = local_88 + 0x10;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_88,
                                             "Unknown reference format in <instance_camera> element"
                                             ,"");
                                  ThrowException(this,(string *)local_88);
                                }
                                local_88._24_8_ = 0;
                                local_88._8_8_ = 0;
                                local_88._16_8_ = 0;
                                local_88._0_8_ = (Node *)(local_88 + 0x10);
                                std::
                                vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
                                ::emplace_back<Assimp::Collada::CameraInstance>
                                          (local_58,(CameraInstance *)local_88);
                                if ((Node *)local_88._0_8_ != (Node *)(local_88 + 0x10)) {
                                  operator_delete((void *)local_88._0_8_);
                                }
                                pCVar11 = (pNode->mCameras).
                                          super__Vector_base<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
                                          ._M_impl.super__Vector_impl_data._M_finish;
                                goto LAB_00403077;
                              }
                              pLVar9 = DefaultLogger::get();
                              pcVar10 = 
                              "Collada: Expected url attribute in <instance_camera> element";
                            }
                            Logger::warn(pLVar9,pcVar10);
                          }
                        }
                      }
                      goto LAB_00402e9f;
                    }
                    pType = TF_TRANSLATE;
                  }
                }
              }
            }
          }
          ReadNodeTransformation(this,pNode,pType);
        }
      }
      else if (iVar5 == 2) {
        return;
      }
LAB_00402e9f:
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar4 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadSceneNode(Node* pNode)
{
    // quit immediately on <bla/> elements
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("node"))
            {
                Node* child = new Node;
                int attrID = TestAttribute("id");
                if (attrID > -1)
                    child->mID = mReader->getAttributeValue(attrID);
                int attrSID = TestAttribute("sid");
                if (attrSID > -1)
                    child->mSID = mReader->getAttributeValue(attrSID);

                int attrName = TestAttribute("name");
                if (attrName > -1)
                    child->mName = mReader->getAttributeValue(attrName);

                // TODO: (thom) support SIDs
                // ai_assert( TestAttribute( "sid") == -1);

                if (pNode)
                {
                    pNode->mChildren.push_back(child);
                    child->mParent = pNode;
                }
                else
                {
                    // no parent node given, probably called from <library_nodes> element.
                    // create new node in node library
                    mNodeLibrary[child->mID] = child;
                }

                // read on recursively from there
                ReadSceneNode(child);
                continue;
            }
            // For any further stuff we need a valid node to work on
            else if (!pNode)
                continue;

            if (IsElement("lookat"))
                ReadNodeTransformation(pNode, TF_LOOKAT);
            else if (IsElement("matrix"))
                ReadNodeTransformation(pNode, TF_MATRIX);
            else if (IsElement("rotate"))
                ReadNodeTransformation(pNode, TF_ROTATE);
            else if (IsElement("scale"))
                ReadNodeTransformation(pNode, TF_SCALE);
            else if (IsElement("skew"))
                ReadNodeTransformation(pNode, TF_SKEW);
            else if (IsElement("translate"))
                ReadNodeTransformation(pNode, TF_TRANSLATE);
            else if (IsElement("render") && pNode->mParent == NULL && 0 == pNode->mPrimaryCamera.length())
            {
                // ... scene evaluation or, in other words, postprocessing pipeline,
                // or, again in other words, a turing-complete description how to
                // render a Collada scene. The only thing that is interesting for
                // us is the primary camera.
                int attrId = TestAttribute("camera_node");
                if (-1 != attrId)
                {
                    const char* s = mReader->getAttributeValue(attrId);
                    if (s[0] != '#')
                        ASSIMP_LOG_ERROR("Collada: Unresolved reference format of camera");
                    else
                        pNode->mPrimaryCamera = s + 1;
                }
            }
            else if (IsElement("instance_node"))
            {
                // find the node in the library
                int attrID = TestAttribute("url");
                if (attrID != -1)
                {
                    const char* s = mReader->getAttributeValue(attrID);
                    if (s[0] != '#')
                        ASSIMP_LOG_ERROR("Collada: Unresolved reference format of node");
                    else
                    {
                        pNode->mNodeInstances.push_back(NodeInstance());
                        pNode->mNodeInstances.back().mNode = s + 1;
                    }
                }
            }
            else if (IsElement("instance_geometry") || IsElement("instance_controller"))
            {
                // Reference to a mesh or controller, with possible material associations
                ReadNodeGeometry(pNode);
            }
            else if (IsElement("instance_light"))
            {
                // Reference to a light, name given in 'url' attribute
                int attrID = TestAttribute("url");
                if (-1 == attrID)
                    ASSIMP_LOG_WARN("Collada: Expected url attribute in <instance_light> element");
                else
                {
                    const char* url = mReader->getAttributeValue(attrID);
                    if (url[0] != '#')
                        ThrowException("Unknown reference format in <instance_light> element");

                    pNode->mLights.push_back(LightInstance());
                    pNode->mLights.back().mLight = url + 1;
                }
            }
            else if (IsElement("instance_camera"))
            {
                // Reference to a camera, name given in 'url' attribute
                int attrID = TestAttribute("url");
                if (-1 == attrID)
                    ASSIMP_LOG_WARN("Collada: Expected url attribute in <instance_camera> element");
                else
                {
                    const char* url = mReader->getAttributeValue(attrID);
                    if (url[0] != '#')
                        ThrowException("Unknown reference format in <instance_camera> element");

                    pNode->mCameras.push_back(CameraInstance());
                    pNode->mCameras.back().mCamera = url + 1;
                }
            }
            else
            {
                // skip everything else for the moment
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            break;
        }
    }
}